

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

bool __thiscall
google::protobuf::DescriptorPool::Tables::AddSymbol(Tables *this,string *full_name,Symbol symbol)

{
  undefined1 *this_00;
  size_type *psVar1;
  _Node **__p;
  _Node *p_Var2;
  size_t sVar3;
  _Node *p_Var4;
  _Node *p_Var5;
  _Node **pp_Var6;
  size_t sVar7;
  key_type *__k;
  _Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
  *this_01;
  size_type extraout_RDX;
  size_type __n;
  size_type __i;
  _Node **pp_Var8;
  pair<bool,_unsigned_long> pVar9;
  char *local_48;
  Type TStack_40;
  undefined4 uStack_3c;
  anon_union_8_7_bfa3a334_for_Symbol_2 local_38;
  
  local_38 = symbol.field_1;
  local_48 = (full_name->_M_dataplus)._M_p;
  TStack_40 = symbol.type;
  this_00 = &(this->symbols_by_name_).
             super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
             .
             super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
             .
             super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
             .
             super__Hash_code_base<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_false>
             .field_0x2;
  sVar3 = hash<const_char_*>::operator()((hash<const_char_*> *)this_00,local_48);
  pp_Var6 = (this->symbols_by_name_).
            super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
            .
            super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
            .
            super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
            ._M_buckets;
  sVar7 = (this->symbols_by_name_).
          super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
          .
          super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
          .
          super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
          ._M_bucket_count;
  __k = (key_type *)(sVar3 % sVar7);
  p_Var4 = std::tr1::
           _Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
           ::_M_find_node((_Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                           *)pp_Var6[(long)__k],(_Node *)&local_48,__k,(_Hash_code_type)pp_Var6);
  if (p_Var4 == (_Node *)0x0) {
    pVar9 = std::tr1::__detail::_Prime_rehash_policy::_M_need_rehash
                      (&(this->symbols_by_name_).
                        super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
                        .
                        super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
                        .
                        super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                        ._M_rehash_policy,sVar7,
                       (this->symbols_by_name_).
                       super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
                       .
                       super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
                       .
                       super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                       ._M_element_count,1);
    this_01 = (_Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
               *)pVar9.second;
    p_Var5 = (_Node *)operator_new(0x20);
    (p_Var5->_M_v).first = local_48;
    *(ulong *)&(p_Var5->_M_v).second = CONCAT44(uStack_3c,TStack_40);
    (p_Var5->_M_v).second.field_1 = local_38;
    p_Var5->_M_next =
         (_Hash_node<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_false>
          *)0x0;
    if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      pp_Var6 = (this->symbols_by_name_).
                super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
                .
                super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
                .
                super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                ._M_buckets;
    }
    else {
      __k = (key_type *)(sVar3 % (ulong)this_01);
      pp_Var6 = std::tr1::
                _Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                ::_M_allocate_buckets(this_01,sVar7);
      __n = extraout_RDX;
      for (pp_Var8 = (_Node **)0x0;
          __p = (_Node **)
                (this->symbols_by_name_).
                super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
                .
                super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
                .
                super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                ._M_bucket_count, pp_Var8 < __p; pp_Var8 = (_Node **)((long)pp_Var8 + 1)) {
        while (p_Var2 = (this->symbols_by_name_).
                        super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
                        .
                        super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
                        .
                        super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                        ._M_buckets[(long)pp_Var8], p_Var2 != (_Node *)0x0) {
          sVar7 = hash<const_char_*>::operator()((hash<const_char_*> *)this_00,(p_Var2->_M_v).first)
          ;
          __n = sVar7 % (ulong)this_01;
          (this->symbols_by_name_).
          super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
          .
          super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
          .
          super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
          ._M_buckets[(long)pp_Var8] = p_Var2->_M_next;
          p_Var2->_M_next = pp_Var6[__n];
          pp_Var6[__n] = p_Var2;
        }
      }
      std::tr1::
      _Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
      ::_M_deallocate_buckets
                ((_Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                  *)(this->symbols_by_name_).
                    super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
                    .
                    super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
                    .
                    super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                    ._M_buckets,__p,__n);
      (this->symbols_by_name_).
      super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
      .
      super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
      .
      super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
      ._M_bucket_count = (size_type)this_01;
      (this->symbols_by_name_).
      super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
      .
      super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
      .
      super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
      ._M_buckets = pp_Var6;
    }
    p_Var5->_M_next = pp_Var6[(long)__k];
    pp_Var6[(long)__k] = p_Var5;
    psVar1 = &(this->symbols_by_name_).
              super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
              .
              super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
              .
              super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
              ._M_element_count;
    *psVar1 = *psVar1 + 1;
    local_48 = (full_name->_M_dataplus)._M_p;
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&this->symbols_after_checkpoint_,
               &local_48);
  }
  return p_Var4 == (_Node *)0x0;
}

Assistant:

bool DescriptorPool::Tables::AddSymbol(
    const string& full_name, Symbol symbol) {
  if (InsertIfNotPresent(&symbols_by_name_, full_name.c_str(), symbol)) {
    symbols_after_checkpoint_.push_back(full_name.c_str());
    return true;
  } else {
    return false;
  }
}